

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

char * utf8_decode(char *s,utfint *val,int strict)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  
  bVar1 = *s;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar3 = 0;
    if ((bVar1 & 0x40) == 0) {
      uVar5 = (uint)bVar1;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar4 = 0;
      uVar6 = (uint)bVar1;
      do {
        uVar3 = (byte)s[uVar7 + 1] & 0x3f | uVar4 << 6;
        if (((byte)s[uVar7 + 1] & 0xffffffc0) != 0x80) {
          cVar9 = '\0';
          goto LAB_0015239f;
        }
        uVar5 = uVar6 * 2;
        uVar7 = uVar7 + 1;
        uVar2 = uVar6 & 0x20;
        uVar4 = uVar3;
        uVar6 = uVar5;
      } while (uVar2 != 0);
    }
    bVar1 = (char)uVar7 * '\x05' & 0x1f;
    uVar4 = (uVar5 & 0x3f) << bVar1 | uVar3;
    cVar9 = (char)(0 << bVar1);
    if (((uint)uVar7 < 6) && (-1 < (int)uVar4)) {
      cVar9 = utf8_decode::limits[uVar7 & 0xffffffff] <= uVar4;
      uVar8 = 0;
      if ((bool)cVar9) {
        uVar8 = uVar7 & 0xffffffff;
      }
      s = s + uVar8;
    }
LAB_0015239f:
    if (cVar9 == '\0') {
      return (char *)0x0;
    }
  }
  if ((strict != 0) && ((uVar4 & 0x1ff800) == 0xd800 || 0x10ffff < uVar4)) {
    return (char *)0x0;
  }
  if (val != (utfint *)0x0) {
    *val = uVar4;
  }
  return s + 1;
}

Assistant:

static const char *utf8_decode (const char *s, utfint *val, int strict) {
  static const utfint limits[] =
        {~(utfint)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  utfint res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if (!iscont(cc))  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((utfint)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}